

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O1

void __thiscall
flow_cutter::AssimilatedNodeSet::
shrink_cut_front<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
          (AssimilatedNodeSet *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph)

{
  int *piVar1;
  pointer piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  pointer piVar4;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_flow_cutter_h:297:25)>
  __pred;
  
  __pred._M_pred.graph =
       (Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
        *)graph;
  __pred._M_pred.this = this;
  _Var3 = std::
          __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<flow_cutter::AssimilatedNodeSet::shrink_cut_front<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>(flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>const&)::_lambda(int)_1_>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     (this->front).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     (this->front).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,__pred);
  piVar1 = (this->front).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((_Var3._M_current != piVar1) &&
     (piVar2 = (this->front).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
     piVar4 = (pointer)((long)_Var3._M_current + ((long)piVar2 - (long)piVar1)), piVar2 != piVar4))
  {
    (this->front).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  return;
}

Assistant:

void shrink_cut_front(const Graph& graph)
    {
        front.erase(std::remove_if(
                        front.begin(), front.end(),
                        [&](int xy) { return node_set.is_inside(graph.head(xy)); }),
            front.end());
    }